

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogl_shader.c
# Opt level: O0

GLuint al_get_opengl_program_object(ALLEGRO_SHADER *shader)

{
  ALLEGRO_SHADER *shader_local;
  GLuint local_4;
  
  if (shader->platform == ALLEGRO_SHADER_GLSL) {
    local_4 = *(GLuint *)&shader[1].pixel_copy;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

GLuint al_get_opengl_program_object(ALLEGRO_SHADER *shader)
{
   ASSERT(shader);
#ifdef ALLEGRO_CFG_SHADER_GLSL
   if (shader->platform != ALLEGRO_SHADER_GLSL)
      return 0;

   return ((ALLEGRO_SHADER_GLSL_S *)shader)->program_object;
#else
   return 0;
#endif
}